

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

string * __thiscall Poisson::getParameter(string *__return_storage_ptr__,Poisson *this,string *name)

{
  bool bVar1;
  stringstream parameter;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::operator==(name,"rate");
  if (bVar1) {
    std::ostream::_M_insert<double>
              (this->poissonRate /
               ((this->super_StochasticEventGenerator).super_StochasticVariable.
                super_StochasticProcess.super_TimeDependent.xTime)->dt);
  }
  else {
    Parametric::getParameter(&local_1c0,(Parametric *)this,name);
    std::operator<<(&local_190,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Poisson::getParameter(const string& name) const
{
	stringstream parameter;
	if (name=="rate")
		parameter << poissonRate/xTime->dt;
	else
		parameter << StochasticEventGenerator::getParameter( name );
	
	return parameter.str();

}